

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O2

void Green(void)

{
  std::operator<<((ostream *)&std::cout,"\x1b[49m\x1b[32m");
  return;
}

Assistant:

void Green()
{
#ifdef _WIN32
	auto h = WinColor();
	SetConsoleTextAttribute(h, FOREGROUND_GREEN);
#else
	std::cout << "\033[49m\033[32m";
#endif
}